

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

BignumCarry
mp_add_masked_integer_into
          (BignumInt *w_out,size_t rw,mp_int *a,uintmax_t b,BignumInt b_and,BignumInt b_xor,
          BignumCarry carry)

{
  size_t i;
  ulong uVar1;
  BignumInt BVar2;
  
  for (i = 0; rw != i; i = i + 1) {
    if (i < a->nw) {
      BVar2 = a->w[i];
    }
    else {
      BVar2 = 0;
    }
    uVar1 = (b ^ b_and) + b_xor;
    b_xor = (ulong)CARRY8(b ^ b_and,b_xor) + (ulong)CARRY8(uVar1,BVar2);
    if (w_out != (BignumInt *)0x0) {
      w_out[i] = uVar1 + BVar2;
    }
    b = 0;
  }
  return i;
}

Assistant:

static BignumCarry mp_add_masked_integer_into(
    BignumInt *w_out, size_t rw, mp_int *a, uintmax_t b,
    BignumInt b_and, BignumInt b_xor, BignumCarry carry)
{
    for (size_t i = 0; i < rw; i++) {
        BignumInt aword = mp_word(a, i);
        BignumInt bword = b;
        b = shift_right_by_one_word(b);
        BignumInt out;
        bword = (bword ^ b_xor) & b_and;
        BignumADC(out, carry, aword, bword, carry);
        if (w_out)
            w_out[i] = out;
    }
    return carry;
}